

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QTzType>::QList(QList<QTzType> *this,qsizetype size)

{
  QArrayDataPointer<QTzType>::QArrayDataPointer(&this->d,size,0,KeepSize);
  if (size != 0) {
    QArrayDataPointer<QTzType>::appendInitialize(&this->d,size);
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }